

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.cpp
# Opt level: O1

size_t __thiscall gpu::Context::getCoresEstimate(Context *this)

{
  long lVar1;
  Data *pDVar2;
  size_t sVar3;
  string local_68;
  string local_48;
  Data *local_28;
  element_type *local_20;
  
  pDVar2 = this->data_;
  if (((pDVar2 == (Data *)0x0) &&
      (pDVar2 = (this->data_ref_).super___shared_ptr<gpu::Context::Data,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr, pDVar2 == (Data *)0x0)) || (pDVar2->type != TypeOpenCL)) {
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_48,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/PolarNick239[P]ExternalSortingOnGPU/libs/gpu/libgpu/context.cpp"
               ,"");
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"No GPU context!","");
    raiseException(&local_48,0xab,&local_68);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p);
    }
    sVar3 = 0x100;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p);
    }
  }
  else {
    cl((Context *)&local_28);
    lVar1._0_4_ = local_28[2].type;
    lVar1._4_4_ = local_28[2].cuda_device;
    if (local_20 != (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_20);
    }
    sVar3 = lVar1 << 8;
  }
  return sVar3;
}

Assistant:

size_t Context::getCoresEstimate()
{
	size_t compute_units = 1;

	switch (type()) {
#ifdef CUDA_SUPPORT
		case Context::TypeCUDA:
			cudaDeviceProp deviceProp;
			CUDA_SAFE_CALL(cudaGetDeviceProperties(&deviceProp, data_->cuda_device));
			compute_units = (size_t) deviceProp.multiProcessorCount;
			break;
#endif
		case Context::TypeOpenCL:
			compute_units = cl()->maxComputeUnits();
			break;
		default:
			gpu::raiseException(__FILE__, __LINE__, "No GPU context!");
	}

	return compute_units * 256;
}